

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
         *this)

{
  FloatFormat *pFVar1;
  ostringstream *poVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  TestLog *pTVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  bool bVar10;
  int iVar11;
  MessageBuilder *this_01;
  undefined8 uVar12;
  IVal *pIVar13;
  IVal *pIVar14;
  TestStatus *__return_storage_ptr___00;
  string *this_02;
  bool bVar15;
  int numErrors;
  IVal in2;
  FloatFormat highpFmt;
  IVal in3;
  void *outputArr [2];
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  outputs;
  void *inputArr [4];
  IVal in0;
  IVal in1;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  FuncSet funcs;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff968;
  long lVar16;
  int local_674;
  size_t local_670;
  TestStatus *local_668;
  FloatFormat *local_660;
  string local_658;
  FloatFormat local_638;
  size_t local_610;
  string local_608;
  pointer local_5e8;
  pointer local_5e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_5d8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  local_5a8;
  pointer local_578;
  pointer local_570;
  pointer local_568;
  pointer local_560;
  undefined1 local_558 [32];
  IVal *local_538;
  Precision local_530;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_528;
  undefined4 local_520;
  IVal local_3d8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_318;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _Rb_tree_node_base *local_298;
  double local_290;
  ResultCollector local_1f8;
  Matrix<tcu::Interval,_2,_4> local_1a8;
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_668 = __return_storage_ptr__;
  iVar11 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_660 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_318,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar11 + 0xdeadbeef),
             in_stack_fffffffffffff968);
  local_670 = (long)local_318.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_318.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>::
  Outputs(&local_5a8,local_670);
  local_638.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_638.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_638.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_638.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_638.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_638.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_638.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_638.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_638._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_674 = 0;
  local_5d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5d8._M_impl.super__Rb_tree_header._M_header;
  local_5d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5d8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  pTVar7 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_578 = local_318.in0.
              super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_570 = local_318.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_568 = local_318.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_560 = local_318.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_5e8 = local_5a8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_5e0 = local_5a8.out1.
              super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (ostringstream *)(local_558 + 8);
  local_558._0_8_ = pTVar7;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_558,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_2b8 + 8);
  local_2b8._8_4_ = _S_red;
  local_2a8._M_allocated_capacity = 0;
  local_290 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_2a8._8_8_ = p_Var3;
  local_298 = p_Var3;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_2b8);
  for (uVar12 = local_2a8._8_8_; (_Rb_tree_node_base *)uVar12 != p_Var3;
      uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
    (**(code **)(**(long **)(uVar12 + 0x20) + 0x30))(*(long **)(uVar12 + 0x20),&local_1a8);
  }
  if (local_290 != 0.0) {
    poVar2 = (ostringstream *)(local_558 + 8);
    local_558._0_8_ = pTVar7;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar2,(string *)&local_3d8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_2b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar13 = (IVal *)&local_5e8;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_670,&local_578,pIVar13,0);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_558);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix(&local_1a8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_2b8);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5d8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_558);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5d8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_3d8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5d8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_658);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5d8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_608);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5d8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5d8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_2b8);
  lVar16 = 0;
  local_610 = local_670;
  iVar11 = 0;
  while( true ) {
    bVar15 = local_610 == 0;
    local_610 = local_610 - 1;
    if (bVar15) break;
    tcu::Matrix<tcu::Interval,_2,_4>::Matrix(&local_1a8);
    tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_2b8);
    pFVar1 = local_660;
    round<tcu::Matrix<float,2,4>>
              (&local_3d8,(shaderexecutor *)local_660,
               (FloatFormat *)
               ((long)((local_318.in0.
                        super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar16),(Matrix<float,_2,_4> *)pIVar13);
    ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
              ((IVal *)local_558,pFVar1,&local_3d8);
    pIVar13 = Environment::lookup<tcu::Matrix<float,2,4>>
                        ((Environment *)&local_5d8,
                         (this->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                         .m_ptr);
    tcu::Matrix<tcu::Interval,_2,_4>::operator=(pIVar13,(Matrix<tcu::Interval,_2,_4> *)local_558);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_5d8,
               (this->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_5d8,
               (this->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_5d8,
               (this->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    local_530 = (this->m_caseCtx).precision;
    pIVar13 = (IVal *)local_660->m_maxValue;
    local_558._0_8_ = *(undefined8 *)local_660;
    local_558._8_4_ = local_660->m_fractionBits;
    local_558._12_4_ = local_660->m_hasSubnormal;
    local_558._16_4_ = local_660->m_hasInf;
    local_558._20_4_ = local_660->m_hasNaN;
    local_558[0x18] = local_660->m_exactPrecision;
    local_558._25_3_ = *(undefined3 *)&local_660->field_0x19;
    local_558._28_4_ = *(undefined4 *)&local_660->field_0x1c;
    local_520 = 0;
    pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_538 = pIVar13;
    local_528 = &local_5d8;
    (*pSVar8->_vptr_Statement[3])(pSVar8,(MessageBuilder *)local_558);
    pIVar14 = Environment::lookup<tcu::Matrix<float,2,4>>
                        ((Environment *)&local_5d8,
                         (this->m_variables).out1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
              ((IVal *)local_558,&local_638,pIVar14);
    tcu::Matrix<tcu::Interval,_2,_4>::operator=
              ((Matrix<tcu::Interval,_2,_4> *)local_2b8,(Matrix<tcu::Interval,_2,_4> *)local_558);
    bVar15 = ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::
             doContains((Matrix<tcu::Interval,_2,_4> *)local_2b8,
                        (Matrix<float,_2,_4> *)
                        ((long)((local_5a8.out1.
                                 super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + lVar16));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_558,"Shader output 1 is outside acceptable range",
               (allocator<char> *)&local_3d8);
    bVar15 = tcu::ResultCollector::check(&local_1f8,bVar15,(string *)local_558);
    std::__cxx11::string::~string((string *)local_558);
    pIVar14 = Environment::lookup<tcu::Matrix<float,2,4>>
                        ((Environment *)&local_5d8,
                         (this->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
              ((IVal *)local_558,&local_638,pIVar14);
    tcu::Matrix<tcu::Interval,_2,_4>::operator=(&local_1a8,(Matrix<tcu::Interval,_2,_4> *)local_558)
    ;
    bVar10 = ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::
             doContains((IVal *)&local_1a8,
                        (Matrix<float,_2,_4> *)
                        ((long)((local_5a8.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + lVar16));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_558,"Shader output 0 is outside acceptable range",
               (allocator<char> *)&local_3d8);
    bVar10 = tcu::ResultCollector::check(&local_1f8,bVar10,(string *)local_558);
    std::__cxx11::string::~string((string *)local_558);
    if (!bVar15 || !bVar10) {
      iVar11 = iVar11 + 1;
      local_674 = iVar11;
      if (iVar11 < 0x65) {
        poVar2 = (ostringstream *)(local_558 + 8);
        local_558._0_8_ = pTVar7;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Failed");
        std::operator<<((ostream *)poVar2," sample:\n");
        std::operator<<((ostream *)poVar2,"\t");
        std::__cxx11::string::string
                  ((string *)&local_3d8,
                   (string *)
                   &((this->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_558 + 8),(string *)&local_3d8);
        std::operator<<((ostream *)(local_558 + 8)," = ");
        valueToString<tcu::Matrix<float,2,4>>
                  (&local_658,(shaderexecutor *)&local_638,
                   (FloatFormat *)
                   ((long)((local_318.in0.
                            super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar16),(Matrix<float,_2,_4> *)pIVar13);
        poVar4 = (ostream *)(local_558 + 8);
        std::operator<<(poVar4,(string *)&local_658);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::operator<<(poVar4,"\t");
        std::__cxx11::string::string
                  ((string *)&local_3d8,
                   (string *)
                   &((this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_558 + 8),(string *)&local_3d8);
        std::operator<<((ostream *)(local_558 + 8)," = ");
        valueToString<tcu::Matrix<float,2,4>>
                  (&local_658,(shaderexecutor *)&local_638,
                   (FloatFormat *)
                   ((long)((local_5a8.out0.
                            super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar16),(Matrix<float,_2,_4> *)pIVar13);
        poVar4 = (ostream *)(local_558 + 8);
        std::operator<<(poVar4,(string *)&local_658);
        std::operator<<(poVar4,"\n");
        std::operator<<(poVar4,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,4>>
                  (&local_608,(shaderexecutor *)&local_638,(FloatFormat *)&local_1a8,pIVar13);
        poVar4 = (ostream *)(local_558 + 8);
        std::operator<<(poVar4,(string *)&local_608);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::operator<<(poVar4,"\t");
        std::__cxx11::string::string
                  ((string *)&local_3d8,
                   (string *)
                   &((this->m_variables).out1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_558 + 8),(string *)&local_3d8);
        std::operator<<((ostream *)(local_558 + 8)," = ");
        valueToString<tcu::Matrix<float,2,4>>
                  (&local_658,(shaderexecutor *)&local_638,
                   (FloatFormat *)
                   ((long)((local_5a8.out1.
                            super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar16),(Matrix<float,_2,_4> *)pIVar13);
        poVar4 = (ostream *)(local_558 + 8);
        std::operator<<(poVar4,(string *)&local_658);
        std::operator<<(poVar4,"\n");
        std::operator<<(poVar4,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,4>>
                  (&local_608,(shaderexecutor *)&local_638,(FloatFormat *)local_2b8,pIVar13);
        poVar4 = (ostream *)(local_558 + 8);
        std::operator<<(poVar4,(string *)&local_608);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_3d8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar4);
      }
    }
    lVar16 = lVar16 + 0x20;
  }
  if (iVar11 < 0x65) {
    if (iVar11 == 0) {
      poVar2 = (ostringstream *)(local_558 + 8);
      local_558._0_8_ = pTVar7;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<((ostream *)poVar2," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_558,"Pass",(allocator<char> *)&local_1a8);
      __return_storage_ptr___00 = local_668;
      tcu::TestStatus::pass(local_668,(string *)local_558);
      this_02 = (string *)local_558;
      goto LAB_008375d5;
    }
  }
  else {
    poVar2 = (ostringstream *)(local_558 + 8);
    local_558._0_8_ = pTVar7;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"(Skipped ");
    std::ostream::operator<<(poVar2,iVar11 + -100);
    std::operator<<((ostream *)poVar2," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  poVar2 = (ostringstream *)(local_558 + 8);
  local_558._0_8_ = pTVar7;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::ostream::operator<<(poVar2,iVar11);
  std::operator<<((ostream *)poVar2,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<((ostream *)poVar2," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  de::toString<int>((string *)&local_1a8,&local_674);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8," test failed. Check log for the details",
             (allocator<char> *)&local_3d8);
  __return_storage_ptr___00 = local_668;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_558);
  std::__cxx11::string::~string((string *)local_558);
  std::__cxx11::string::~string((string *)local_2b8);
  this_02 = (string *)&local_1a8;
LAB_008375d5:
  std::__cxx11::string::~string(this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_5d8);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>::
  ~Outputs(&local_5a8);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_318);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}